

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

PalCsWaiterReturnState CorUnix::PALCS_WaitOnCS(PAL_CRITICAL_SECTION *pPalCriticalSection,LONG lInc)

{
  bool bVar1;
  PalCsInitState PVar2;
  uint Comperand;
  uint uVar3;
  PAL_ERROR PVar4;
  int *Destination;
  undefined8 in_R9;
  undefined4 uVar5;
  PAL_ERROR palErr;
  DWORD lNewVal;
  DWORD lVal;
  LONG lInc_local;
  PAL_CRITICAL_SECTION *pPalCriticalSection_local;
  
  uVar5 = 0;
  PVar2 = ::Volatile::operator_cast_to_PalCsInitState
                    ((Volatile *)&pPalCriticalSection->cisInitState);
  if ((PVar2 == PalCsFullyInitialized) ||
     (bVar1 = PALCS_FullyInitialize(pPalCriticalSection), bVar1)) {
    if ((lInc != 4) && (lInc != 2)) {
      fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x496,in_R9,uVar5);
      fprintf(_stderr,
              "Expression: PALCS_LOCK_WAITER_INC == lInc || PALCS_LOCK_AWAKENED_WAITER == lInc\n");
    }
    do {
      Comperand = ::Volatile::operator_cast_to_int((Volatile *)&pPalCriticalSection->LockCount);
      if ((lInc != 4) && ((Comperand & 2) == 0)) {
        fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x49e);
        fprintf(_stderr,
                "Expression: PALCS_LOCK_WAITER_INC == lInc || PALCS_LOCK_AWAKENED_WAITER & lVal\n");
      }
      if ((Comperand & 1) == 0) {
        return PalCsWaiterDidntWait;
      }
      if ((lInc != 4) && ((Comperand + lInc & 2) != 0)) {
        fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x4ac);
        fprintf(_stderr,
                "Expression: PALCS_LOCK_WAITER_INC == lInc || 0 == (PALCS_LOCK_AWAKENED_WAITER & lNewVal), Description: "
               );
      }
      Destination = Volatile<int>::operator&(&pPalCriticalSection->LockCount);
      uVar3 = InterlockedCompareExchange(Destination,Comperand + lInc,Comperand);
    } while (uVar3 != Comperand);
    if (pPalCriticalSection->DebugInfo != (PCRITICAL_SECTION_DEBUG_INFO)0x0) {
      Volatile<int>::operator+=(&pPalCriticalSection->DebugInfo->lContentionCount,1);
    }
    PVar4 = PALCS_DoActualWait(pPalCriticalSection);
    if (PVar4 != 0) {
      fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x4c4);
      fprintf(_stderr,"Expression: NO_ERROR == palErr, Description: Native CS wait failed\n");
    }
    pPalCriticalSection_local._4_4_ = PalCsReturnWaiterAwakened;
  }
  else {
    pPalCriticalSection_local._4_4_ = PalCsWaiterDidntWait;
  }
  return pPalCriticalSection_local._4_4_;
}

Assistant:

PalCsWaiterReturnState PALCS_WaitOnCS(PAL_CRITICAL_SECTION * pPalCriticalSection,
                                          LONG lInc)
    {
        DWORD lVal, lNewVal;
        PAL_ERROR palErr = NO_ERROR;

        if (PalCsFullyInitialized != pPalCriticalSection->cisInitState)
        {
            // First contention, the CS native wait support need to be
            // initialized at this time
            if (!PALCS_FullyInitialize(pPalCriticalSection))
            {
                // The current thread failed the full initialization of the CS,
                // whether because another thread is race-initializing it, or
                // there are no enough memory/resources at this time, or
                // InitializeCriticalSection has never been called. By
                // returning we will cause the thread to spin on CS trying
                // again until the CS is initialized
                return PalCsWaiterDidntWait;
            }
        }

        // Make sure we have a valid waiter increment
        _ASSERTE(PALCS_LOCK_WAITER_INC == lInc ||
                 PALCS_LOCK_AWAKENED_WAITER == lInc);

        do {
            lVal = pPalCriticalSection->LockCount;

            // Make sure the waiter increment is compatible with the
            // awakened waiter bit value
            _ASSERTE(PALCS_LOCK_WAITER_INC == lInc ||
                     PALCS_LOCK_AWAKENED_WAITER & lVal);

            if (0 == (lVal & PALCS_LOCK_BIT))
            {
                // the CS is no longer locked, let's bail out
                return PalCsWaiterDidntWait;
            }

            lNewVal = lVal + lInc;

            // Make sure that this thread was whether an incoming one or it
            // was an awakened waiter and, in this case, we are now going to
            // turn off the awakened waiter bit
            _ASSERT_MSG(PALCS_LOCK_WAITER_INC == lInc ||
                        0 == (PALCS_LOCK_AWAKENED_WAITER & lNewVal));

            CS_TRACE("[WCS %p] Switching from {%d, %d, %d} to "
                "{%d, %d, %d} ==> ", pPalCriticalSection,
                PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal),
                PALCS_GETWCOUNT(lNewVal), PALCS_GETAWBIT(lNewVal), PALCS_GETLBIT(lNewVal));

            lNewVal = InterlockedCompareExchange (&pPalCriticalSection->LockCount,
                                                  lNewVal, lVal);

            CS_TRACE("[WCS %p] ==> %s\n", pPalCriticalSection,
                           (lNewVal == lVal) ? "OK" : "NO");

        } while (lNewVal != lVal);

#ifdef _DEBUG
        if (NULL != pPalCriticalSection->DebugInfo)
        {
            pPalCriticalSection->DebugInfo->lContentionCount += 1;
        }
#endif // _DEBUG

        // Do the actual native wait
        palErr = PALCS_DoActualWait(pPalCriticalSection);
        _ASSERT_MSG(NO_ERROR == palErr, "Native CS wait failed\n");

        return PalCsReturnWaiterAwakened;
    }